

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O1

int __thiscall sqlite::Connection::Stmt::bind_parameter_index(Stmt *this,string *name)

{
  int iVar1;
  Logic_error *this_00;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  allocator local_a9;
  long *local_a8;
  long local_a0;
  long local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = sqlite3_bind_parameter_index(this->stmt_,(name->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    return iVar1;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_48,"Error looking up index for bind var ",name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_a8 == plVar4) {
    local_98 = *plVar4;
    uStack_90 = (undefined4)plVar2[3];
    uStack_8c = *(undefined4 *)((long)plVar2 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
  local_88._M_dataplus._M_p = (pointer)*plVar2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_88._M_dataplus._M_p == psVar5) {
    local_88.field_2._M_allocated_capacity = *psVar5;
    local_88.field_2._8_4_ = (undefined4)plVar2[3];
    local_88.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar5;
  }
  local_88._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pcVar3 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_68,pcVar3,&local_a9);
  Logic_error::Logic_error(this_00,&local_88,&local_68,1,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

int Connection::Stmt::bind_parameter_index(const std::string & name)
    {
        int index = sqlite3_bind_parameter_index(stmt_, name.c_str());
        if(!index)
        {
            throw Logic_error("Error looking up index for bind var " +
                name + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), SQLITE_ERROR, db_);
        }
        return index;
    }